

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables
          (TargetProgress *this,unsigned_long total,unsigned_long *current)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  iterator __position;
  ulong uVar4;
  unsigned_long num;
  cmGeneratedFileStream fout;
  unsigned_long local_288;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_280;
  cmGeneratedFileStream local_278;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&this->VariableFile,false,None);
  if (this->NumberOfActions != 0) {
    local_280 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->Marks;
    uVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,"CMAKE_PROGRESS_",0xf);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      if (total < 0x65) {
        local_288 = *current + uVar4;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
        __position._M_current =
             (this->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_280,__position,&local_288);
        }
        else {
LAB_002ec623:
          *__position._M_current = local_288;
          (this->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        uVar3 = (*current + uVar4) * 100;
        uVar2 = uVar3 / total;
        if ((uVar3 - 100) / total < uVar2) {
          local_288 = uVar2;
          std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
          __position._M_current =
               (this->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (this->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002ec623;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_280,__position,&local_288);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 <= this->NumberOfActions);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
  *current = *current + this->NumberOfActions;
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables(
  unsigned long total, unsigned long& current)
{
  cmGeneratedFileStream fout(this->VariableFile);
  for (unsigned long i = 1; i <= this->NumberOfActions; ++i) {
    fout << "CMAKE_PROGRESS_" << i << " = ";
    if (total <= 100) {
      unsigned long num = i + current;
      fout << num;
      this->Marks.push_back(num);
    } else if (((i + current) * 100) / total >
               ((i - 1 + current) * 100) / total) {
      unsigned long num = ((i + current) * 100) / total;
      fout << num;
      this->Marks.push_back(num);
    }
    fout << "\n";
  }
  fout << "\n";
  current += this->NumberOfActions;
}